

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_CopySubArray(JSContext *ctx,JSValue obj,int64_t to_pos,int64_t from_pos,int64_t count,int dir
                   )

{
  JSValue obj_00;
  JSValue obj_01;
  JSValue val_00;
  JSValue this_obj;
  int iVar1;
  JSContext *ctx_00;
  long idx;
  JSValueUnion in_RCX;
  JSValue *in_RDX;
  int64_t in_RDI;
  int64_t in_R8;
  JSValueUnion in_R9;
  int fromPresent;
  JSContext *unaff_retaddr;
  JSValue val;
  int64_t to;
  int64_t from;
  int64_t i;
  int in_stack_ffffffffffffffac;
  JSValueUnion ctx_01;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  ctx_01.float64 = 0.0;
  while( true ) {
    if ((long)in_R9.ptr <= (long)ctx_01.ptr) {
      return 0;
    }
    if ((int)val.u._0_4_ < 0) {
      ctx_00 = (JSContext *)((long)in_R9.ptr + (in_R8 - (long)ctx_01) + -1);
      idx = (((long)in_RCX.ptr + (long)in_R9.ptr) - (long)ctx_01) + -1;
    }
    else {
      ctx_00 = (JSContext *)(in_R8 + (long)ctx_01.ptr);
      idx = (long)in_RCX.ptr + (long)ctx_01.ptr;
    }
    obj_00._4_12_ = val._4_12_;
    obj_00.u.int32 = val.u.int32;
    iVar1 = JS_TryGetPropertyInt64
                      (unaff_retaddr,obj_00,
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDX);
    if (iVar1 < 0) break;
    if (iVar1 == 0) {
      obj_01.tag = (int64_t)in_R9.ptr;
      obj_01.u.ptr = ctx_01.ptr;
      iVar1 = JS_DeletePropertyInt64(ctx_00,obj_01,idx,in_stack_ffffffffffffffac);
    }
    else {
      this_obj.tag = in_RDI;
      this_obj.u.ptr = in_RCX.ptr;
      val_00.tag = in_R8;
      val_00.u.ptr = in_R9.ptr;
      iVar1 = JS_SetPropertyInt64((JSContext *)ctx_01.ptr,this_obj,(int64_t)ctx_00,val_00);
    }
    if (iVar1 < 0) {
      return -1;
    }
    ctx_01.float64 = ctx_01.float64 + 1;
  }
  return -1;
}

Assistant:

static int JS_CopySubArray(JSContext *ctx,
                           JSValueConst obj, int64_t to_pos,
                           int64_t from_pos, int64_t count, int dir)
{
    int64_t i, from, to;
    JSValue val;
    int fromPresent;

    /* XXX: should special case fast arrays */
    for (i = 0; i < count; i++) {
        if (dir < 0) {
            from = from_pos + count - i - 1;
            to = to_pos + count - i - 1;
        } else {
            from = from_pos + i;
            to = to_pos + i;
        }
        fromPresent = JS_TryGetPropertyInt64(ctx, obj, from, &val);
        if (fromPresent < 0)
            goto exception;

        if (fromPresent) {
            if (JS_SetPropertyInt64(ctx, obj, to, val) < 0)
                goto exception;
        } else {
            if (JS_DeletePropertyInt64(ctx, obj, to, JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    return 0;

 exception:
    return -1;
}